

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamANCF_3333.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementBeamANCF_3333::Calc_Sxi_eta_compact
          (ChElementBeamANCF_3333 *this,VectorN *Sxi_eta_compact,double xi,double eta,double zeta)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar4 [64];
  
  auVar4._8_56_ = in_register_00001208;
  auVar4._0_8_ = xi;
  (Sxi_eta_compact->super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>).m_storage.m_data.
  array[0] = 0.0;
  auVar3 = auVar4._0_16_;
  auVar2 = vfmsub213sd_fma(auVar3,auVar3,auVar3);
  auVar1 = vfmadd213sd_fma(auVar3,auVar3,auVar3);
  auVar3 = vfnmadd213sd_fma(auVar3,auVar3,ZEXT816(0x3ff0000000000000));
  (Sxi_eta_compact->super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>).m_storage.m_data.
  array[1] = auVar2._0_8_ * this->m_thicknessY * 0.25;
  (Sxi_eta_compact->super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>).m_storage.m_data.
  array[2] = 0.0;
  (Sxi_eta_compact->super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>).m_storage.m_data.
  array[3] = 0.0;
  (Sxi_eta_compact->super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>).m_storage.m_data.
  array[4] = auVar1._0_8_ * this->m_thicknessY * 0.25;
  (Sxi_eta_compact->super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>).m_storage.m_data.
  array[5] = 0.0;
  (Sxi_eta_compact->super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>).m_storage.m_data.
  array[6] = 0.0;
  (Sxi_eta_compact->super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>).m_storage.m_data.
  array[7] = auVar3._0_8_ * this->m_thicknessY * 0.5;
  (Sxi_eta_compact->super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>).m_storage.m_data.
  array[8] = 0.0;
  return;
}

Assistant:

void ChElementBeamANCF_3333::Calc_Sxi_eta_compact(VectorN& Sxi_eta_compact, double xi, double eta, double zeta) {
    Sxi_eta_compact(0) = 0.0;
    Sxi_eta_compact(1) = 0.25 * m_thicknessY * (xi * xi - xi);
    Sxi_eta_compact(2) = 0.0;
    Sxi_eta_compact(3) = 0.0;
    Sxi_eta_compact(4) = 0.25 * m_thicknessY * (xi * xi + xi);
    Sxi_eta_compact(5) = 0.0;
    Sxi_eta_compact(6) = 0.0;
    Sxi_eta_compact(7) = 0.5 * m_thicknessY * (1 - xi * xi);
    Sxi_eta_compact(8) = 0.0;
}